

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_red.c
# Opt level: O0

void zzRedBarr(word *a,word *mod,size_t n,word *barr_param,void *stack)

{
  word *a_00;
  word wVar1;
  size_t in_RCX;
  word *in_RDX;
  word *in_RSI;
  word *in_RDI;
  long in_R8;
  word *qm;
  word *q;
  size_t i;
  word w;
  word *local_38;
  ulong local_30;
  word *stack_00;
  
  a_00 = (word *)(in_R8 + (long)in_RDX * 0x10 + 0x18);
  stack_00 = a_00 + (long)in_RDX * 2 + 2;
  zzMul(qm,in_RDI,(size_t)in_RSI,in_RDX,in_RCX,stack_00);
  zzMul(qm,in_RDI,(size_t)in_RSI,in_RDX,in_RCX,stack_00);
  zzSub2(in_RDI,a_00,(long)in_RDX + 1);
  local_30 = 1;
  for (local_38 = (word *)0x0; local_38 < in_RDX; local_38 = (word *)((long)local_38 + 1)) {
    local_30 = (long)(int)(uint)(in_RSI[(long)local_38] < in_RDI[(long)local_38]) |
               (long)(int)(uint)(in_RSI[(long)local_38] == in_RDI[(long)local_38]) & local_30;
  }
  wVar1 = zzSubAndW(in_RDI,in_RSI,(size_t)in_RDX,-(in_RDI[(long)in_RDX] | local_30));
  in_RDI[(long)in_RDX] = in_RDI[(long)in_RDX] - wVar1;
  local_30 = 1;
  for (local_38 = (word *)0x0; local_38 < in_RDX; local_38 = (word *)((long)local_38 + 1)) {
    local_30 = (long)(int)(uint)(in_RSI[(long)local_38] < in_RDI[(long)local_38]) |
               (long)(int)(uint)(in_RSI[(long)local_38] == in_RDI[(long)local_38]) & local_30;
  }
  zzSubAndW(in_RDI,in_RSI,(size_t)in_RDX,-(in_RDI[(long)in_RDX] | local_30));
  return;
}

Assistant:

void SAFE(zzRedBarr)(word a[], const word mod[], size_t n, 
	const word barr_param[], void* stack)
{
	register word w;
	size_t i;
	// переменные в stack
	word* q = (word*)stack;
	word* qm = q + (n + 1) + (n + 2);
	stack = qm + (n + 2) + n;
	// pre
	ASSERT(wwIsDisjoint2(a, 2 * n, mod, n));
	ASSERT(wwIsDisjoint2(a, 2 * n, barr_param, n + 2));
	ASSERT(n > 0 && mod[n - 1] != 0);
	// q <- (a \div B^{n - 1}) * barr_param
	zzMul(q, a + n - 1, n + 1, barr_param, n + 2, stack);
	// qm <- (q \div B^{n + 1}) * mod
	zzMul(qm, q + n + 1, n + 2, mod, n, stack);
	// a <- [n + 1]a - [n + 1]qm
	zzSub2(a, qm, n + 1);
	// a >= mod? => a -= mod
	for (i = 0, w = 1; i < n; ++i)
	{
		w &= wordEq01(mod[i], a[i]);
		w |= wordLess01(mod[i], a[i]);
	}
	w |= a[n], w = WORD_0 - w;
	a[n] -= zzSubAndW(a, mod, n, w);
	// a >= mod? => a -= mod
	for (i = 0, w = 1; i < n; ++i)
	{
		w &= wordEq01(mod[i], a[i]);
		w |= wordLess01(mod[i], a[i]);
	}
	w |= a[n], w = WORD_0 - w;
	zzSubAndW(a, mod, n, w);
	// очистка
	w = 0;
}